

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

_Bool AArch64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  uint8_t *puVar3;
  DecodeStatus DVar4;
  uint8_t *orig_p;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint64_t Address;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint8_t *orig_p_2;
  uint8_t *puVar12;
  ulong uVar13;
  byte *pbVar14;
  uint64_t Value_4;
  uint8_t *orig_p_1;
  long lVar15;
  DecodeStatus local_3c;
  
  uVar6 = 0;
  DVar4 = MCDisassembler_Fail;
  if (3 < code_len) {
    __s = instr->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      lVar15 = 0;
      memset(__s,0,0x220);
      do {
        puVar3 = instr->flat_insn->detail->groups + lVar15 + 0x15;
        puVar3[0] = 0xff;
        puVar3[1] = 0xff;
        puVar3[2] = 0xff;
        puVar3[3] = 0xff;
        lVar15 = lVar15 + 0x38;
      } while (lVar15 != 0x1c0);
    }
    if (*(int *)(ud + 4) < 0) {
      uVar7 = *(uint *)code;
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    }
    else {
      uVar7 = *(uint *)code;
    }
    uVar11 = 0;
    local_3c = MCDisassembler_Success;
    Address = 0xffffffff;
    puVar3 = "\x01\x1a\x03\x02\x02V\x04\x01\x1d\x03\x02";
LAB_001f8297:
    puVar12 = puVar3;
    switch(*puVar12) {
    case '\x01':
      uVar11 = ~(-1 << (puVar12[2] & 0x1f)) << (puVar12[1] & 0x1f);
      if (puVar12[2] == 0x20) {
        uVar11 = 0xffffffff;
      }
      uVar11 = (uVar11 & uVar7) >> (puVar12[1] & 0x1f);
      puVar3 = puVar12 + 3;
      goto LAB_001f8297;
    case '\x02':
      uVar9 = 0;
      address = 0;
      bVar5 = 0;
      do {
        lVar15 = uVar9 + 1;
        address = address + ((ulong)(puVar12[lVar15] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar12[lVar15] < '\0');
      puVar3 = puVar12 + (uVar9 & 0xffffffff) + 3;
      if (uVar11 != (uint)address) {
        puVar3 = puVar12 + (uVar9 & 0xffffffff) + 3 +
                 *(ushort *)(puVar12 + (uVar9 & 0xffffffff) + 1);
      }
      goto LAB_001f8297;
    case '\x03':
      uVar8 = ~(-1 << (puVar12[2] & 0x1f)) << (puVar12[1] & 0x1f);
      uVar9 = 0;
      address = 0;
      bVar5 = 0;
      do {
        lVar15 = uVar9 + 3;
        address = address + ((ulong)(puVar12[lVar15] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar12[lVar15] < '\0');
      if (puVar12[2] == 0x20) {
        uVar8 = 0xffffffff;
      }
      puVar3 = puVar12 + (uVar9 & 0xffffffff) + 5;
      if ((uVar8 & uVar7) >> (puVar12[1] & 0x1f) != (uint)address) {
        puVar3 = puVar12 + (uVar9 & 0xffffffff) + 5 +
                 *(ushort *)(puVar12 + (uVar9 & 0xffffffff) + 3);
      }
      goto LAB_001f8297;
    case '\x04':
      uVar9 = 0;
      do {
        lVar15 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while ((char)puVar12[lVar15] < '\0');
      puVar3 = puVar12 + (uVar9 & 0xffffffff) + 3;
      goto LAB_001f8297;
    case '\x05':
      uVar9 = 0;
      lVar15 = 0;
      bVar5 = 0;
      do {
        lVar10 = uVar9 + 1;
        lVar15 = lVar15 + ((ulong)(puVar12[lVar10] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar12[lVar10] < '\0');
      pbVar14 = puVar12 + (uVar9 & 0xffffffff) + 1;
      lVar10 = 0;
      bVar5 = 0;
      do {
        bVar1 = *pbVar14;
        lVar10 = lVar10 + ((ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        pbVar14 = pbVar14 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(instr,(uint)lVar15);
      DVar4 = decodeToMCInst(local_3c,(uint)lVar10,uVar7,instr,Address,(void *)address);
      if (DVar4 == MCDisassembler_Fail) {
switchD_001f82ad_default:
        MCInst_clear(instr);
        uVar6 = 0;
        DVar4 = MCDisassembler_Fail;
      }
      else {
        uVar6 = 4;
      }
      break;
    case '\x06':
      uVar9 = 0;
      lVar15 = 0;
      bVar5 = 0;
      do {
        lVar10 = uVar9 + 1;
        lVar15 = lVar15 + ((ulong)(puVar12[lVar10] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar12[lVar10] < '\0');
      uVar13 = 0;
      lVar10 = 0;
      bVar5 = 0;
      do {
        lVar2 = uVar13 + (uVar9 & 0xffffffff) + 1;
        lVar10 = lVar10 + ((ulong)(puVar12[lVar2] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar12[lVar2] < '\0');
      uVar8 = (uint)lVar10 & ~uVar7 | (uint)lVar15 & uVar7;
      address = (uint64_t)uVar8;
      puVar3 = puVar12 + (uVar13 & 0xffffffff) + (uVar9 & 0xffffffff) + 1;
      if (uVar8 != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      goto LAB_001f8297;
    default:
      goto switchD_001f82ad_default;
    }
  }
  *size = uVar6;
  return DVar4 == MCDisassembler_Success;
}

Assistant:

bool AArch64_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _getInstruction((cs_struct *)ud, instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}